

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevcd_nal.c
# Opt level: O0

WORD32 ihevcd_nal_search_start_code(UWORD8 *pu1_buf,WORD32 bytes_remaining)

{
  bool bVar1;
  WORD32 WVar2;
  WORD32 start_code_found;
  WORD32 zero_byte_cnt;
  WORD32 ofst;
  WORD32 bytes_remaining_local;
  UWORD8 *pu1_buf_local;
  
  ofst = -1;
  zero_byte_cnt = 0;
  bVar1 = false;
  WVar2 = ofst;
  do {
    while( true ) {
      ofst = WVar2;
      if (bytes_remaining + -1 <= ofst) goto LAB_001153b9;
      WVar2 = ofst + 1;
      if (pu1_buf[WVar2] == '\0') break;
      zero_byte_cnt = 0;
    }
    zero_byte_cnt = zero_byte_cnt + 1;
  } while ((pu1_buf[ofst + 2] != '\x01') || (zero_byte_cnt < 2));
  ofst = ofst + 2;
  bVar1 = true;
LAB_001153b9:
  if (((!bVar1) && (pu1_buf[ofst] == '\x01')) && (1 < zero_byte_cnt)) {
    ofst = ofst + 1;
  }
  return ofst + 1;
}

Assistant:

WORD32 ihevcd_nal_search_start_code(UWORD8 *pu1_buf, WORD32 bytes_remaining)
{
    WORD32 ofst;

    WORD32 zero_byte_cnt;
    WORD32 start_code_found;

    ofst = -1;

    zero_byte_cnt = 0;
    start_code_found = 0;
    while(ofst < (bytes_remaining - 1))
    {
        ofst++;
        if(pu1_buf[ofst] != 0)
        {
            zero_byte_cnt = 0;
            continue;
        }

        zero_byte_cnt++;
        if((pu1_buf[ofst + 1] == START_CODE_PREFIX_BYTE) &&
           (zero_byte_cnt >= NUM_ZEROS_BEFORE_START_CODE))
        {
            /* Found the start code */
            ofst++;
            start_code_found = 1;
            break;
        }
    }
    if(0 == start_code_found)
    {
        if((START_CODE_PREFIX_BYTE == pu1_buf[ofst]) &&
           (zero_byte_cnt >= NUM_ZEROS_BEFORE_START_CODE))
        {
            /* Found a start code at the end*/
            ofst++;
        }
    }
    /* Since ofst started at -1, increment it by 1 */
    ofst++;

    return ofst;
}